

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  TokenKind endKind;
  SyntaxKind SVar4;
  int iVar5;
  EVP_PKEY_CTX *ctx;
  HierarchyInstantiationSyntax *pHVar6;
  PortDeclarationSyntax *pPVar7;
  MemberSyntax *pMVar8;
  CheckerInstantiationSyntax *pCVar9;
  ImmediateAssertionMemberSyntax *pIVar10;
  DPIExportSyntax *pDVar11;
  undefined8 uVar12;
  StatementSyntax *statement;
  ProceduralBlockSyntax *pPVar13;
  TimeUnitsDeclarationSyntax *pTVar14;
  UdpDeclarationSyntax *pUVar15;
  PropertyDeclarationSyntax *pPVar16;
  IfGenerateSyntax *pIVar17;
  DPIImportSyntax *pDVar18;
  LoopGenerateSyntax *pLVar19;
  GenvarDeclarationSyntax *pGVar20;
  undefined4 extraout_var;
  GenerateRegionSyntax *pGVar21;
  DefParamSyntax *pDVar22;
  CheckerDeclarationSyntax *pCVar23;
  NetAliasSyntax *pNVar24;
  BindDirectiveSyntax *pBVar25;
  CaseGenerateSyntax *pCVar26;
  ContinuousAssignSyntax *pCVar27;
  ConfigDeclarationSyntax *pCVar28;
  CovergroupDeclarationSyntax *pCVar29;
  Token *pTVar30;
  NamedLabelSyntax *label;
  SpecparamDeclarationSyntax *pSVar31;
  ClassDeclarationSyntax *pCVar32;
  ElabSystemTaskSyntax *pEVar33;
  PrimitiveInstantiationSyntax *pPVar34;
  SourceLocation SVar35;
  EmptyMemberSyntax *pEVar36;
  ConcurrentAssertionStatementSyntax *pCVar37;
  ConcurrentAssertionMemberSyntax *pCVar38;
  SpecifyBlockSyntax *pSVar39;
  SequenceDeclarationSyntax *pSVar40;
  ModportDeclarationSyntax *pMVar41;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar42;
  PackageImportDeclarationSyntax *pPVar43;
  FunctionDeclarationSyntax *pFVar44;
  Diagnostic *pDVar45;
  undefined4 extraout_var_00;
  uint uVar46;
  __extent_storage<18446744073709551615UL> _Var47;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  byte bVar48;
  BumpAllocator *pBVar49;
  TokenKind TVar50;
  uint32_t offset;
  bool bVar51;
  AttrList attributes;
  Token TVar52;
  Token colon;
  SourceRange SVar53;
  Token TVar54;
  string_view sVar55;
  Token keyword;
  Token keyword_00;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  bool anyLocalModules_1;
  Token *local_118;
  Token *local_110;
  Token endgenerate;
  Token token;
  MemberSyntax *member;
  Info *local_e0;
  undefined8 local_d8;
  TokenList local_d0;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  Token local_40;
  
  attributes = parseAttributes(this);
  _Var47 = attributes._M_extent._M_extent_value;
  ctx = (EVP_PKEY_CTX *)attributes._M_ptr;
  bVar2 = isHierarchyInstantiation(this,false);
  if (bVar2) {
    pHVar6 = parseHierarchyInstantiation(this,attributes);
    return &pHVar6->super_MemberSyntax;
  }
  bVar2 = isPortDeclaration(this,false);
  if (bVar2) {
    pPVar7 = parsePortDeclaration(this,attributes);
    return &pPVar7->super_MemberSyntax;
  }
  bVar2 = isNetDeclaration(this);
  if (bVar2) {
    pMVar8 = parseNetDeclaration(this,attributes);
    return pMVar8;
  }
  bVar2 = isVariableDeclaration(this);
  if (bVar2) {
LAB_002a91a3:
    pMVar8 = parseVariableDeclaration(this,attributes);
    return pMVar8;
  }
  token = ParserBase::peek(&this->super_ParserBase);
  uVar46 = token._0_4_ & 0xffff;
  TVar50 = token.kind;
  switch(uVar46) {
  case 0x5e:
    pNVar24 = parseNetAlias(this,attributes);
    return &pNVar24->super_MemberSyntax;
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
switchD_002a93a4_caseD_a8:
    TVar52 = ParserBase::consume(&this->super_ParserBase);
    local_118 = (Token *)TVar52.info;
    uVar12 = TVar52._0_8_;
    local_110 = (Token *)&this->factory;
    SVar4 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar52.kind);
    bVar2 = false;
LAB_002a9434:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_006a3268;
    members.stackBase._0_8_ = _Var47._M_extent_value;
    members.stackBase._8_16_ = attributes;
    statement = parseStatement(this,bVar2,false);
    keyword_00.info = (Info *)local_118;
    keyword_00.kind = (short)uVar12;
    keyword_00._2_1_ = (char)((ulong)uVar12 >> 0x10);
    keyword_00.numFlags.raw = (char)((ulong)uVar12 >> 0x18);
    keyword_00.rawLen = (int)((ulong)uVar12 >> 0x20);
    pPVar13 = slang::syntax::SyntaxFactory::proceduralBlock
                        ((SyntaxFactory *)local_110,SVar4,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,keyword_00,
                         statement);
    return &pPVar13->super_MemberSyntax;
  case 99:
  case 0x67:
  case 0x68:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x7b:
  case 0x7d:
  case 0x7f:
  case 0x80:
  case 0x83:
  case 0x84:
  case 0x85:
    break;
  case 100:
  case 0x66:
  case 0x81:
    pCVar37 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar46 = (pCVar37->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar46 < 4) && (uVar46 != 1)) {
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
           CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)&PTR_getChild_006a3268;
      members.stackBase._0_8_ = _Var47._M_extent_value;
      members.stackBase._8_16_ = attributes;
      pIVar10 = slang::syntax::SyntaxFactory::immediateAssertionMember
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                           (ImmediateAssertionStatementSyntax *)pCVar37);
      return &pIVar10->super_MemberSyntax;
    }
LAB_002a9dc7:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_006a3268;
    members.stackBase._0_8_ = _Var47._M_extent_value;
    members.stackBase._8_16_ = attributes;
    pCVar38 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,pCVar37);
    return &pCVar38->super_MemberSyntax;
  case 0x65:
    pCVar27 = parseContinuousAssign(this,attributes);
    return &pCVar27->super_MemberSyntax;
  case 0x69:
    errorIfAttributes(this,attributes);
    if (_Var47._M_extent_value == 0) {
      SVar35 = Token::location(&token);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xc70005,SVar35);
      pMVar8 = parseGenerateBlock(this);
      return pMVar8;
    }
    goto LAB_002a9d04;
  case 0x6a:
    pBVar25 = parseBindDirective(this,attributes);
    return &pBVar25->super_MemberSyntax;
  case 0x73:
    pCVar26 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar26->super_MemberSyntax;
  case 0x78:
    pCVar23 = parseCheckerDeclaration(this,attributes);
    return &pCVar23->super_MemberSyntax;
  case 0x79:
    Token::Token(&local_40);
    pCVar32 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar32->super_MemberSyntax;
  case 0x7a:
    goto switchD_002a932a_caseD_7a;
  case 0x7c:
    errorIfAttributes(this,attributes);
    pCVar28 = parseConfigDeclaration(this,attributes);
    return &pCVar28->super_MemberSyntax;
  case 0x7e:
    pMVar8 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0),true);
    return pMVar8;
  case 0x82:
    pCVar29 = parseCovergroupDeclaration(this,attributes,false,false);
    return &pCVar29->super_MemberSyntax;
  case 0x86:
switchD_002a93a4_caseD_b3:
    TVar52 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar52.kind == ClockingKeyword) {
switchD_002a932a_caseD_7a:
      pMVar8 = parseClockingDeclaration(this,attributes);
      return pMVar8;
    }
    TVar52 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar50 == DefaultKeyword && TVar52.kind == DisableKeyword) {
      pMVar8 = parseDefaultDisable(this,attributes);
      return pMVar8;
    }
    break;
  case 0x87:
    pDVar22 = parseDefParam(this,attributes);
    return &pDVar22->super_MemberSyntax;
  default:
    switch(uVar46) {
    case 0xa5:
      TVar52 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar52.kind == StringLiteral) {
        pDVar11 = parseDPIExport(this,attributes);
        return &pDVar11->super_MemberSyntax;
      }
      pMVar8 = parseExportDeclaration(this,attributes);
      return pMVar8;
    case 0xa6:
    case 0xa9:
    case 0xab:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb4:
    case 0xb5:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
      break;
    case 0xa7:
      errorIfAttributes(this,attributes);
      pEVar33 = (ElabSystemTaskSyntax *)parseExternMember(this,parentKind,attributes);
LAB_002a9c33:
      if (pEVar33 != (ElabSystemTaskSyntax *)0x0) {
        return &pEVar33->super_MemberSyntax;
      }
      break;
    case 0xa8:
      goto switchD_002a93a4_caseD_a8;
    case 0xaa:
      pLVar19 = parseLoopGenerateConstruct(this,attributes);
      return &pLVar19->super_MemberSyntax;
    case 0xb0:
      SVar4 = FunctionDeclaration;
      TVar50 = EndFunctionKeyword;
LAB_002a9dac:
      pFVar44 = parseFunctionDeclaration
                          (this,attributes,SVar4,TVar50,parentKind,
                           (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
      return &pFVar44->super_MemberSyntax;
    case 0xb1:
      errorIfAttributes(this,attributes);
      TVar52 = ParserBase::consume(&this->super_ParserBase);
      local_e0 = TVar52.info;
      local_d8 = TVar52._0_8_;
      Token::Token(&endgenerate);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
      anyLocalModules_1 = false;
      local_118 = &(this->super_ParserBase).lastPoppedDelims.first;
      local_110 = &(this->super_ParserBase).lastPoppedDelims.second;
      bVar2 = false;
      while( true ) {
        TVar52 = ParserBase::peek(&this->super_ParserBase);
        if ((TVar52.kind == EndOfFile) || ((TVar52._0_4_ & 0xffff) == 0x95)) break;
        member = parseMember(this,GenerateRegion,&anyLocalModules_1);
        bVar51 = member == (MemberSyntax *)0x0;
        if (bVar51) {
          bVar3 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar52.kind);
          if (bVar3) {
            local_d0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            SVar53 = Token::range((Token *)&local_d0);
            pDVar45 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,SVar53);
            local_d0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            sVar55 = Token::valueText((Token *)&local_d0);
            Diagnostic::operator<<(pDVar45,sVar55);
            bVar48 = 0;
            if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
               (bVar48 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
              SVar35 = Token::location(local_118);
              Diagnostic::addNote(pDVar45,(DiagCode)0xc10005,SVar35);
              SVar35 = Token::location(local_110);
              Diagnostic::addNote(pDVar45,(DiagCode)0xc00005,SVar35);
              bVar48 = 0;
            }
          }
          else {
            bVar48 = ~bVar2 & 1;
          }
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)bVar48 << 0x20 | 0x450005));
          bVar2 = bVar51;
        }
        else {
          checkMemberAllowed(this,&member->super_SyntaxNode,GenerateRegion);
          SmallVectorBase<slang::syntax::MemberSyntax*>::
          emplace_back<slang::syntax::MemberSyntax*const&>
                    ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
          pSVar1 = this->previewNode;
          this->previewNode = (SyntaxNode *)0x0;
          (member->super_SyntaxNode).previewNode = pSVar1;
          bVar2 = bVar51;
        }
      }
      if (anyLocalModules_1 == true) {
        SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::pop_back(&(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
      }
      endgenerate = ParserBase::expect(&this->super_ParserBase,EndGenerateKeyword);
      pBVar49 = (this->super_ParserBase).alloc;
      iVar5 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                        (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                         (EVP_PKEY_CTX *)pBVar49,(EVP_PKEY_CTX *)endgenerate.info);
      SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
                (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                 (EVP_PKEY_CTX *)pBVar49);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
           CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)&PTR_getChild_006a3268;
      local_d0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
      local_d0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_d0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_d0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3358;
      keyword.info = local_e0;
      keyword.kind = (undefined2)local_d8;
      keyword._2_1_ = local_d8._2_1_;
      keyword.numFlags.raw = local_d8._3_1_;
      keyword.rawLen = local_d8._4_4_;
      local_d0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
           (pointer)CONCAT44(extraout_var,iVar5);
      members.stackBase._0_8_ = _Var47._M_extent_value;
      members.stackBase._8_16_ = attributes;
      pGVar21 = slang::syntax::SyntaxFactory::generateRegion
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,keyword,
                           (SyntaxList<slang::syntax::MemberSyntax> *)&local_d0,endgenerate);
      return &pGVar21->super_MemberSyntax;
    case 0xb2:
      pGVar20 = parseGenvarDeclaration(this,attributes);
      return &pGVar20->super_MemberSyntax;
    case 0xb3:
      goto switchD_002a93a4_caseD_b3;
    case 0xb6:
      pIVar17 = parseIfGenerateConstruct(this,attributes);
      return &pIVar17->super_MemberSyntax;
    case 0xbd:
      TVar52 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar52.kind == StringLiteral) {
        pDVar18 = parseDPIImport(this,attributes);
        return &pDVar18->super_MemberSyntax;
      }
      pPVar43 = parseImportDeclaration(this,attributes);
      return &pPVar43->super_MemberSyntax;
    default:
      switch(uVar46) {
      case 0xe8:
      case 0xef:
        goto switchD_002a9469_caseD_e8;
      case 0xe9:
      case 0xea:
      case 0xeb:
      case 0xec:
      case 0xee:
        goto switchD_002a9469_caseD_e9;
      case 0xed:
        pUVar15 = parseUdpDeclaration(this,attributes);
        return &pUVar15->super_MemberSyntax;
      case 0xf0:
        pPVar16 = parsePropertyDeclaration(this,attributes);
        return &pPVar16->super_MemberSyntax;
      default:
        if (uVar46 - 0x12d < 2) {
          errorIfAttributes(this,attributes);
          pTVar14 = parseTimeUnitsDeclaration(this,attributes);
          return &pTVar14->super_MemberSyntax;
        }
        if (uVar46 == 2) {
          TVar52 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar52.kind == Colon) {
            TVar52 = ParserBase::peek(&this->super_ParserBase,2);
            pTVar30 = TVar52._0_8_;
            uVar46 = TVar52.kind - 100;
            if ((uVar46 < 0x1e) && ((0x20000005U >> (uVar46 & 0x1f) & 1) != 0)) {
              local_118 = pTVar30;
              TVar52 = ParserBase::consume(&this->super_ParserBase);
              this_00 = &this->factory;
              colon = ParserBase::expect(&this->super_ParserBase,Colon);
              label = slang::syntax::SyntaxFactory::namedLabel(this_00,TVar52,colon);
              pCVar37 = (ConcurrentAssertionStatementSyntax *)
                        parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
              uVar46 = (pCVar37->super_StatementSyntax).super_SyntaxNode.kind -
                       ImmediateAssertStatement;
              if ((uVar46 < 4) && (uVar46 != 1)) {
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
                     CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_
                              ,1);
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                     (pointer)&PTR_getChild_006a3268;
                members.stackBase._0_8_ = _Var47._M_extent_value;
                members.stackBase._8_16_ = attributes;
                anyLocalModules =
                     (bool *)slang::syntax::SyntaxFactory::immediateAssertionMember
                                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax>
                                                 *)&members,
                                        (ImmediateAssertionStatementSyntax *)pCVar37);
                pTVar30 = local_118;
              }
              else {
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
                     CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_
                              ,1);
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
                members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                     (pointer)&PTR_getChild_006a3268;
                members.stackBase._0_8_ = _Var47._M_extent_value;
                members.stackBase._8_16_ = attributes;
                anyLocalModules =
                     (bool *)slang::syntax::SyntaxFactory::concurrentAssertionMember
                                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax>
                                                 *)&members,pCVar37);
                pTVar30 = local_118;
              }
            }
            uVar46 = ((uint)pTVar30 & 0xffff) - 100;
            if ((uVar46 < 0x1e) && ((0x20000005U >> (uVar46 & 0x1f) & 1) != 0)) {
              return &((ConcurrentAssertionMemberSyntax *)anyLocalModules)->super_MemberSyntax;
            }
          }
          TVar52 = ParserBase::peek(&this->super_ParserBase,1);
          if ((TVar52.kind == Hash) ||
             (TVar52 = ParserBase::peek(&this->super_ParserBase,1), TVar52.kind == OpenParenthesis))
          {
            pPVar34 = parsePrimitiveInstantiation(this,attributes);
            return &pPVar34->super_MemberSyntax;
          }
          TVar52 = ParserBase::peek(&this->super_ParserBase,1);
          if (((TVar52.kind == DoubleColon) &&
              (TVar52 = ParserBase::peek(&this->super_ParserBase,2), TVar52.kind == Identifier)) &&
             (TVar52 = ParserBase::peek(&this->super_ParserBase,3), TVar52.kind == Identifier)) {
            pCVar9 = parseCheckerInstantiation(this,attributes);
            return &pCVar9->super_MemberSyntax;
          }
          pMVar8 = parseVariableDeclaration(this,attributes);
          return pMVar8;
        }
        if (uVar46 == 3) {
          pEVar33 = parseElabSystemTask(this,attributes);
          goto LAB_002a9c33;
        }
        if (uVar46 != 0x13) {
          if (uVar46 == 0xc0) {
            TVar52 = ParserBase::consume(&this->super_ParserBase);
            local_118 = (Token *)TVar52.info;
            uVar12 = TVar52._0_8_;
            local_110 = (Token *)&this->factory;
            SVar4 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar52.kind);
            bVar2 = true;
            goto LAB_002a9434;
          }
          if (uVar46 == 200) {
            TVar52 = ParserBase::peek(&this->super_ParserBase,1);
            if (TVar52.kind == ClassKeyword) {
LAB_002a9bf8:
              TVar52 = ParserBase::consume(&this->super_ParserBase);
              pCVar32 = parseClassDeclaration(this,attributes,TVar52);
              return &pCVar32->super_MemberSyntax;
            }
switchD_002a9469_caseD_e8:
            pMVar8 = parseModule(this,attributes,parentKind,anyLocalModules);
            return pMVar8;
          }
          if (uVar46 == 0xd5) goto switchD_002a9469_caseD_e8;
          if (uVar46 == 0xd8) {
            pMVar41 = parseModportDeclaration(this,attributes);
            return &pMVar41->super_MemberSyntax;
          }
          if (uVar46 == 0xd9) goto switchD_002a9469_caseD_e8;
          if (uVar46 == 0xf9) {
            TVar52 = ParserBase::consume(&this->super_ParserBase);
            local_118 = TVar52._0_8_;
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
                 CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
            members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
                 (pointer)&PTR_getChild_006a3268;
            members.stackBase._0_8_ = _Var47._M_extent_value;
            members.stackBase._8_16_ = attributes;
            data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
            TVar54.info = TVar52.info;
            TVar54._0_8_ = local_118;
            pCVar42 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                                (&this->factory,
                                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,
                                 TVar54,data);
            return &pCVar42->super_MemberSyntax;
          }
          if (uVar46 == 0x105) {
            pCVar37 = parseConcurrentAssertion
                                (this,(NamedLabelSyntax *)0x0,(AttrList)(ZEXT416(0) << 0x40));
            goto LAB_002a9dc7;
          }
          if (uVar46 == 0x112) {
            pSVar40 = parseSequenceDeclaration(this,attributes);
            return &pSVar40->super_MemberSyntax;
          }
          if (uVar46 == 0x11a) {
            errorIfAttributes(this,attributes);
            pSVar39 = parseSpecifyBlock(this,attributes);
            return &pSVar39->super_MemberSyntax;
          }
          if (uVar46 == 0x11b) {
            pSVar31 = parseSpecparam(this,attributes,parentKind);
            return &pSVar31->super_MemberSyntax;
          }
          if (uVar46 == 0x129) {
            SVar4 = TaskDeclaration;
            TVar50 = EndTaskKeyword;
            goto LAB_002a9dac;
          }
          if (uVar46 == 0x145) {
            TVar52 = ParserBase::peek(&this->super_ParserBase,1);
            if (TVar52.kind == ClassKeyword) goto LAB_002a9bf8;
          }
          else if (uVar46 == 0x155) {
            TVar52 = ParserBase::peek(&this->super_ParserBase,1);
            if (((TVar52.kind == DoubleColon) &&
                (TVar52 = ParserBase::peek(&this->super_ParserBase,2), TVar52.kind == Identifier))
               && (TVar52 = ParserBase::peek(&this->super_ParserBase,3), TVar52.kind == Identifier))
            {
              pCVar9 = parseCheckerInstantiation(this,attributes);
              return &pCVar9->super_MemberSyntax;
            }
            goto LAB_002a91a3;
          }
          goto switchD_002a9469_caseD_e9;
        }
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
             CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
        members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
             (pointer)&PTR_getChild_006a3268;
        local_d0.super_SyntaxListBase.super_SyntaxNode.kind = 2;
        local_d0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value
             = 0;
        local_d0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_d0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_d0.super_SyntaxListBase.childCount = 0;
        local_d0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
        local_d0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3868;
        members.stackBase._0_8_ = _Var47._M_extent_value;
        members.stackBase._8_16_ = attributes;
        TVar54 = ParserBase::consume(&this->super_ParserBase);
      }
      goto LAB_002a9d7b;
    }
  }
switchD_002a9469_caseD_e9:
  bVar2 = slang::syntax::SyntaxFacts::isGateType(TVar50);
  if (bVar2) {
    pPVar34 = parsePrimitiveInstantiation(this,attributes);
    return &pPVar34->super_MemberSyntax;
  }
  bVar2 = slang::syntax::SyntaxFacts::isMethodQualifier(TVar50);
  if (bVar2) {
    Token::Token((Token *)&local_d0);
    offset = 0;
    do {
      offset = offset + 1;
      local_d0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,offset);
      bVar2 = slang::syntax::SyntaxFacts::isMethodQualifier
                        ((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase);
    } while (bVar2);
    if ((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase == ConstraintKeyword) {
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
           (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
      members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 4;
      src = extraout_RDX;
      while (bVar2 = offset != 0, offset = offset - 1, bVar2) {
        endgenerate = ParserBase::consume(&this->super_ParserBase);
        SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                  ((SmallVectorBase<slang::parsing::Token> *)&members,&endgenerate);
        src = extraout_RDX_00;
        if ((endgenerate.kind != StaticKeyword) &&
           (bVar2 = slang::syntax::SyntaxFacts::isConstraintQualifier(endgenerate.kind),
           src = extraout_RDX_01, bVar2)) {
          SVar53 = Token::range(&endgenerate);
          pDVar45 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xf0005,SVar53);
          sVar55 = Token::valueText(&endgenerate);
          Diagnostic::operator<<(pDVar45,sVar55);
          src = extraout_RDX_02;
        }
      }
      iVar5 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)&members,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      qualifiers._M_ptr._4_4_ = extraout_var_00;
      qualifiers._M_ptr._0_4_ = iVar5;
      qualifiers._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
      pMVar8 = parseConstraint(this,attributes,qualifiers,true);
      SmallVectorBase<slang::parsing::Token>::cleanup
                ((SmallVectorBase<slang::parsing::Token> *)&members,ctx);
      return pMVar8;
    }
    if (((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase == TaskKeyword) ||
       ((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword)) {
      SVar53 = Token::range(&token);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x9b0005,SVar53);
      while (bVar2 = offset != 0, offset = offset - 1, bVar2) {
        ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
      }
      SVar4 = TaskDeclaration;
      if ((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword) {
        SVar4 = FunctionDeclaration;
      }
      endKind = slang::syntax::SyntaxFacts::getSkipToKind
                          ((TokenKind)local_d0.super_SyntaxListBase._vptr_SyntaxListBase);
      pFVar44 = parseFunctionDeclaration
                          (this,attributes,SVar4,endKind,parentKind,
                           (bitmask<slang::parsing::detail::FunctionOptions>)0x0);
      return &pFVar44->super_MemberSyntax;
    }
  }
  if (_Var47._M_extent_value == 0) {
    pEVar36 = (EmptyMemberSyntax *)0x0;
  }
  else {
LAB_002a9d04:
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
         CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_006a3268;
    local_d0.super_SyntaxListBase.super_SyntaxNode.kind = 2;
    local_d0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_d0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_d0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value = 0
    ;
    local_d0.super_SyntaxListBase.childCount = 0;
    local_d0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
    local_d0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a3868;
    pBVar49 = (this->super_ParserBase).alloc;
    members.stackBase._0_8_ = _Var47._M_extent_value;
    members.stackBase._8_16_ = attributes;
    SVar35 = Token::location(&token);
    TVar54 = Token::createMissing(pBVar49,Semicolon,SVar35);
LAB_002a9d7b:
    pEVar36 = slang::syntax::SyntaxFactory::emptyMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members,&local_d0,
                         TVar54);
  }
  return &pEVar36->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes, parentKind);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes, /* inClass */ false,
                                               /* hasBaseClass */ false);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {}, true);
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc), true);
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}